

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O2

void __thiscall gepard::GepardEngine::stroke(GepardEngine *this)

{
  anon_union_8_3_4e90da17_for_Vec4_0 *state;
  GepardGLES2 *this_00;
  PathData *this_01;
  pointer pGVar1;
  anon_union_8_3_4e90da17_for_Vec4_0 aVar2;
  anon_union_8_3_4e90b0ec_for_Vec4_2 aVar3;
  anon_union_8_3_4e909a07_for_Vec4_6 aVar4;
  bool bVar5;
  ulong uVar6;
  anon_union_8_3_4e90da17_for_Vec4_0 aStack_2b8;
  anon_union_8_3_4e90b0ec_for_Vec4_2 aStack_2b0;
  anon_union_8_3_4e909dac_for_Vec4_4 aStack_2a8;
  anon_union_8_3_4e909a07_for_Vec4_6 aStack_2a0;
  StrokePathBuilder SStack_298;
  
  this_00 = this->_engineBackend;
  if (this_00 != (GepardGLES2 *)0x0) {
    this_01 = (this_00->_context->path)._pathData;
    if (this_01 != (PathData *)0x0) {
      pGVar1 = (this_00->_context->states).
               super__Vector_base<gepard::GepardState,_std::allocator<gepard::GepardState>_>._M_impl
               .super__Vector_impl_data._M_finish;
      bVar5 = PathData::isEmpty(this_01);
      if (!bVar5) {
        uVar6 = -(ulong)(pGVar1[-1].miterLimit != 0.0);
        StrokePathBuilder::StrokePathBuilder
                  (&SStack_298,pGVar1[-1].lineWitdh,
                   (Float)(~uVar6 & 0x4024000000000000 | (ulong)pGVar1[-1].miterLimit & uVar6),
                   pGVar1[-1].lineJoinMode,pGVar1[-1].lineCapMode);
        StrokePathBuilder::convertStrokeToFill(&SStack_298,this_01);
        state = (anon_union_8_3_4e90da17_for_Vec4_0 *)(pGVar1 + -1);
        Color::Color((Color *)&aStack_2b8,(Color *)state);
        aVar2 = pGVar1[-1].strokeColor.super_Vec4.field_0;
        aVar3 = pGVar1[-1].strokeColor.super_Vec4.field_1;
        aVar4 = pGVar1[-1].strokeColor.super_Vec4.field_3;
        pGVar1[-1].fillColor.super_Vec4.field_2 = pGVar1[-1].strokeColor.super_Vec4.field_2;
        pGVar1[-1].fillColor.super_Vec4.field_3 = aVar4;
        *state = aVar2;
        pGVar1[-1].fillColor.super_Vec4.field_1 = aVar3;
        gles2::GepardGLES2::fillPath(this_00,&SStack_298._path,(GepardState *)state);
        pGVar1[-1].fillColor.super_Vec4.field_2 = aStack_2a8;
        pGVar1[-1].fillColor.super_Vec4.field_3 = aStack_2a0;
        *state = aStack_2b8;
        pGVar1[-1].fillColor.super_Vec4.field_1 = aStack_2b0;
        StrokePathBuilder::~StrokePathBuilder(&SStack_298);
      }
    }
    return;
  }
  __assert_fail("_engineBackend",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/gepard-engine.cpp"
                ,0xfa,"void gepard::GepardEngine::stroke()");
}

Assistant:

void GepardEngine::stroke()
{
    GD_ASSERT(_engineBackend);
#ifdef GD_USE_GLES2
    _engineBackend->strokePath();
#else // !GD_USE_GLES2
    _engineBackend->stroke();
#endif // GD_USE_GLES2
}